

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_rank_many(roaring_bitmap_t *bm,uint32_t *begin,uint32_t *end,uint64_t *ans)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  undefined8 *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  int *in_RDI;
  uint32_t consumed;
  uint32_t key;
  uint32_t xhigh;
  uint32_t x;
  uint32_t *iter;
  int i;
  uint64_t size;
  container_t *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb8;
  int iVar4;
  container_t *c;
  undefined8 *local_20;
  
  c = (container_t *)0x0;
  iVar4 = 0;
  local_20 = in_RCX;
  while (iVar4 < *in_RDI && in_RSI != in_RDX) {
    uVar2 = *in_RSI >> 0x10;
    uVar1 = *(ushort *)(*(long *)(in_RDI + 4) + (long)iVar4 * 2);
    if (uVar1 < uVar2) {
      iVar3 = container_get_cardinality(in_stack_ffffffffffffffa8,'\0');
      c = (container_t *)((long)iVar3 + (long)c);
      iVar4 = iVar4 + 1;
    }
    else if (uVar2 == uVar1) {
      in_stack_ffffffffffffffb8 =
           container_rank_many(c,(uint8_t)((uint)iVar4 >> 0x18),(uint64_t)in_RSI,
                               (uint32_t *)CONCAT44(*in_RSI,uVar2),
                               (uint32_t *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffb8),
                               (uint64_t *)
                               CONCAT17(iVar4 < *in_RDI && in_RSI != in_RDX,
                                        in_stack_ffffffffffffffb0));
      in_RSI = in_RSI + in_stack_ffffffffffffffb8;
      local_20 = local_20 + in_stack_ffffffffffffffb8;
    }
    else {
      *local_20 = c;
      in_RSI = in_RSI + 1;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_rank_many(const roaring_bitmap_t *bm, const uint32_t *begin,
                              const uint32_t *end, uint64_t *ans) {
    uint64_t size = 0;

    int i = 0;
    const uint32_t *iter = begin;
    while (i < bm->high_low_container.size && iter != end) {
        uint32_t x = *iter;
        uint32_t xhigh = x >> 16;
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
            i++;
        } else if (xhigh == key) {
            uint32_t consumed = container_rank_many(
                bm->high_low_container.containers[i],
                bm->high_low_container.typecodes[i], size, iter, end, ans);
            iter += consumed;
            ans += consumed;
        } else {
            *(ans++) = size;
            iter++;
        }
    }
}